

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

void ps_free_searches(ps_decoder_t *ps)

{
  hash_iter_t *itor;
  
  if (ps->searches != (hash_table_t *)0x0) {
    for (itor = hash_table_iter(ps->searches); itor != (hash_iter_t *)0x0;
        itor = hash_table_iter_next(itor)) {
      (**(code **)(*itor->ent->val + 0x20))();
    }
    hash_table_free(ps->searches);
  }
  ps->searches = (hash_table_t *)0x0;
  ps->search = (ps_search_t *)0x0;
  return;
}

Assistant:

static void
ps_free_searches(ps_decoder_t *ps)
{
    if (ps->searches) {
        hash_iter_t *search_it;
        for (search_it = hash_table_iter(ps->searches); search_it;
             search_it = hash_table_iter_next(search_it)) {
            ps_search_free(hash_entry_val(search_it->ent));
        }
        hash_table_free(ps->searches);
    }

    ps->searches = NULL;
    ps->search = NULL;
}